

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenBoundingBoxesProcess.cpp
# Opt level: O0

void Assimp::checkMesh(aiMesh *mesh,aiVector3D *min,aiVector3D *max)

{
  aiVector3D *paVar1;
  aiVector3D *pos;
  uint i;
  aiVector3D *max_local;
  aiVector3D *min_local;
  aiMesh *mesh_local;
  
  if (mesh == (aiMesh *)0x0) {
    __assert_fail("nullptr != mesh",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/GenBoundingBoxesProcess.cpp"
                  ,0x41,"void Assimp::checkMesh(aiMesh *, aiVector3D &, aiVector3D &)");
  }
  if (mesh->mNumVertices != 0) {
    for (pos._4_4_ = 0; pos._4_4_ < mesh->mNumVertices; pos._4_4_ = pos._4_4_ + 1) {
      paVar1 = mesh->mVertices + pos._4_4_;
      if (paVar1->x < min->x) {
        min->x = paVar1->x;
      }
      if (paVar1->y < min->y) {
        min->y = paVar1->y;
      }
      if (paVar1->z < min->z) {
        min->z = paVar1->z;
      }
      if (max->x <= paVar1->x && paVar1->x != max->x) {
        max->x = paVar1->x;
      }
      if (max->y <= paVar1->y && paVar1->y != max->y) {
        max->y = paVar1->y;
      }
      if (max->z <= paVar1->z && paVar1->z != max->z) {
        max->z = paVar1->z;
      }
    }
  }
  return;
}

Assistant:

void checkMesh(aiMesh* mesh, aiVector3D& min, aiVector3D& max) {
    ai_assert(nullptr != mesh);

    if (0 == mesh->mNumVertices) {
        return;
    }

    for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
        const aiVector3D &pos = mesh->mVertices[i];
        if (pos.x < min.x) {
            min.x = pos.x;
        }
        if (pos.y < min.y) {
            min.y = pos.y;
        }
        if (pos.z < min.z) {
            min.z = pos.z;
        }

        if (pos.x > max.x) {
            max.x = pos.x;
        }
        if (pos.y > max.y) {
            max.y = pos.y;
        }
        if (pos.z > max.z) {
            max.z = pos.z;
        }
    }
}